

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVassoc_split_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVaction EVar1;
  CMFormat p_Var2;
  CManager in_RDX;
  CMFormat f;
  EVaction ret;
  EVassoc_split_action_request *request;
  EV_int_response response;
  FMStructDescList in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  p_Var2 = CMlookup_format((CManager_conflict)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
  if (p_Var2 == (CMFormat)0x0) {
    INT_CMregister_format
              (in_RDX,(FMStructDescList)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  EVar1 = EVassoc_split_action
                    ((CManager_conflict)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (EVstone)((ulong)in_RDX >> 0x20),
                     (EVstone *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  CMwrite((CMConnection)CONCAT44(EVar1,*(undefined4 *)&in_RDX->transports),(CMFormat)in_RDX,
          (void *)CONCAT44(EVar1,in_stack_ffffffffffffffc0));
  return;
}

Assistant:

static void
REVassoc_split_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVassoc_split_action_request *request = (EVassoc_split_action_request *) data;
    EVaction ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVassoc_split_action(cm, request->stone, request->target_list);
    response.ret = (int) ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}